

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::RegistryHub::~RegistryHub(RegistryHub *this)

{
  RegistryHub *this_local;
  
  (this->super_IRegistryHub)._vptr_IRegistryHub = (_func_int **)&PTR__RegistryHub_00d53490;
  (this->super_IMutableRegistryHub)._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_00d53510;
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__RegistryHub_00d53568;
  Detail::EnumValuesRegistry::~EnumValuesRegistry(&this->m_enumValuesRegistry);
  StartupExceptionRegistry::~StartupExceptionRegistry(&this->m_exceptionRegistry);
  TagAliasRegistry::~TagAliasRegistry(&this->m_tagAliasRegistry);
  ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(&this->m_exceptionTranslatorRegistry);
  ReporterRegistry::~ReporterRegistry(&this->m_reporterRegistry);
  TestRegistry::~TestRegistry(&this->m_testCaseRegistry);
  NonCopyable::~NonCopyable(&this->super_NonCopyable);
  IMutableRegistryHub::~IMutableRegistryHub(&this->super_IMutableRegistryHub);
  IRegistryHub::~IRegistryHub(&this->super_IRegistryHub);
  return;
}

Assistant:

IReporterRegistry const &getReporterRegistry() const override { return m_reporterRegistry; }